

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest::ParseAndBuildFileWithErrorSubstr
          (ValidationErrorTest *this,string_view file_name,string_view file_text,
          string_view expected_errors)

{
  FileDescriptor *pFVar1;
  StringLike<std::basic_string_view<char>_> *substring;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  char *pcVar2;
  AssertHelper local_190;
  AssertHelper local_188;
  AssertionResult gtest_ar_;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  MockErrorCollector error_collector;
  FileDescriptorProto local_108;
  
  pcVar2 = file_text._M_str;
  error_collector.text_._M_dataplus._M_p = (pointer)&error_collector.text_.field_2;
  error_collector.super_ErrorCollector._vptr_ErrorCollector =
       (_func_int **)&PTR__MockErrorCollector_015ffce0;
  error_collector.text_._M_string_length = 0;
  error_collector.text_.field_2._M_local_buf[0] = '\0';
  error_collector.warning_text_._M_dataplus._M_p = (pointer)&error_collector.warning_text_.field_2;
  error_collector.warning_text_._M_string_length = 0;
  error_collector.warning_text_.field_2._M_local_buf[0] = '\0';
  ParseFile(&local_108,this,file_name,file_text);
  pFVar1 = DescriptorPool::BuildFileCollectingErrors
                     (&this->pool_,&local_108,&error_collector.super_ErrorCollector);
  gtest_ar_.success_ = pFVar1 == (FileDescriptor *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  FileDescriptorProto::~FileDescriptorProto(&local_108);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_108,(internal *)&gtest_ar_,
               (AssertionResult *)
               "pool_.BuildFileCollectingErrors(ParseFile(file_name, file_text), &error_collector) == nullptr"
               ,"false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x120a,(char *)local_108.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    std::__cxx11::string::~string((string *)&local_108);
    if (local_190.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_190.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  testing::HasSubstr<std::basic_string_view<char,std::char_traits<char>>>
            (&local_170,(testing *)&expected_errors,substring);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_108,(internal *)&local_170,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&gtest_ar_,(char *)&local_108,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "error_collector.text_");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_170);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_108);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x120b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_108.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_108.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  MockErrorCollector::~MockErrorCollector(&error_collector);
  return;
}

Assistant:

void ParseAndBuildFileWithErrorSubstr(absl::string_view file_name,
                                        absl::string_view file_text,
                                        absl::string_view expected_errors) {
    MockErrorCollector error_collector;
    EXPECT_TRUE(pool_.BuildFileCollectingErrors(ParseFile(file_name, file_text),
                                                &error_collector) == nullptr);
    EXPECT_THAT(error_collector.text_, HasSubstr(expected_errors));
  }